

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# access.c
# Opt level: O0

Bool CheckMetaData(TidyDocImpl *doc,Node *node,Bool HasMetaData)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  Bool BVar4;
  int iVar5;
  ctmbstr ptVar6;
  AttVal *pAVar7;
  AttVal *av_1;
  ctmbstr word;
  AttVal *av;
  Bool ContainsAttr;
  Bool HasContent;
  Bool HasHttpEquiv;
  Bool HasMetaData_local;
  Node *node_local;
  TidyDocImpl *doc_local;
  
  bVar2 = false;
  bVar1 = false;
  bVar3 = false;
  BVar4 = Level2_Enabled(doc);
  HasContent = HasMetaData;
  if (BVar4 != no) {
    if (((node != (Node *)0x0) && (node->tag != (Dict *)0x0)) && (node->tag->id == TidyTag_META)) {
      for (word = (ctmbstr)node->attributes; word != (ctmbstr)0x0; word = *(ctmbstr *)word) {
        if ((((word != (ctmbstr)0x0) && (*(long *)(word + 8) != 0)) &&
            ((**(int **)(word + 8) == 0x3d &&
             ((BVar4 = hasValue((AttVal *)word), BVar4 != no && (bVar3 = true, word != (ctmbstr)0x0)
              ))))) &&
           ((*(long *)(word + 0x30) != 0 &&
            (iVar5 = prvTidytmbstrcasecmp(*(ctmbstr *)(word + 0x30),"refresh"), iVar5 == 0)))) {
          bVar2 = true;
          prvTidyReportAccessError(doc,node,0x17c);
        }
        if ((((word != (ctmbstr)0x0) && (*(long *)(word + 8) != 0)) &&
            (**(int **)(word + 8) == 0x23)) && (BVar4 = hasValue((AttVal *)word), BVar4 != no)) {
          bVar3 = true;
          iVar5 = prvTidytmbstrncmp(*(ctmbstr *)(word + 0x30),"http:",5);
          if (iVar5 == 0) {
            bVar1 = true;
            prvTidyReportAccessError(doc,node,0x17d);
          }
        }
      }
      if ((bVar1) || (bVar2)) {
        HasContent = yes;
        prvTidyReportAccessError(doc,node,0x1a8);
      }
      else if (bVar3) {
        HasContent = yes;
      }
    }
    if (((HasContent == no) && (node != (Node *)0x0)) &&
       ((node->tag != (Dict *)0x0 &&
        ((((node->tag->id == TidyTag_ADDRESS && (node->content != (Node *)0x0)) &&
          (node->content->tag != (Dict *)0x0)) && (node->content->tag->id == TidyTag_A)))))) {
      HasContent = yes;
    }
    if ((HasContent == no) &&
       ((((node == (Node *)0x0 || (node->tag == (Dict *)0x0)) || (node->tag->id != TidyTag_TITLE))
        && (BVar4 = prvTidynodeIsText(node->content), BVar4 != no)))) {
      ptVar6 = textFromOneNode(doc,node->content);
      BVar4 = IsWhitespace(ptVar6);
      if (BVar4 == no) {
        HasContent = yes;
      }
    }
    if ((((HasContent == no) && (node != (Node *)0x0)) &&
        ((node->tag != (Dict *)0x0 && (node->tag->id == TidyTag_LINK)))) &&
       (((pAVar7 = prvTidyAttrGetById(node,TidyAttr_REL), pAVar7 == (AttVal *)0x0 ||
         (pAVar7->value == (tmbstr)0x0)) ||
        (ptVar6 = prvTidytmbsubstr(pAVar7->value,"stylesheet"), ptVar6 == (ctmbstr)0x0)))) {
      HasContent = yes;
    }
    for (_HasHttpEquiv = node->content; _HasHttpEquiv != (Node *)0x0;
        _HasHttpEquiv = _HasHttpEquiv->next) {
      HasContent = CheckMetaData(doc,_HasHttpEquiv,HasContent);
    }
  }
  return HasContent;
}

Assistant:

static Bool CheckMetaData( TidyDocImpl* doc, Node* node, Bool HasMetaData )
{
    Bool HasHttpEquiv = no;
    Bool HasContent = no;
    Bool ContainsAttr = no;

    if (Level2_Enabled( doc ))
    {
        if ( nodeIsMETA(node) )
        {
            AttVal* av;
            for (av = node->attributes; av != NULL; av = av->next)
            {
                if ( attrIsHTTP_EQUIV(av) && hasValue(av) )
                {
                    ContainsAttr = yes;

                    /* Must not have an auto-refresh */
                    if (AttrValueIs(av, "refresh"))
                    {
                        HasHttpEquiv = yes;
                        TY_(ReportAccessError)( doc, node, REMOVE_AUTO_REFRESH );
                    }
                }

                if ( attrIsCONTENT(av) && hasValue(av) )
                {
                    ContainsAttr = yes;

                    /* If the value is not an integer, then it must not be a URL */
                    if ( TY_(tmbstrncmp)(av->value, "http:", 5) == 0)
                    {
                        HasContent = yes;
                        TY_(ReportAccessError)( doc, node, REMOVE_AUTO_REDIRECT);
                    }
                }
            }
        
            if ( HasContent || HasHttpEquiv )
            {
                HasMetaData = yes;
                TY_(ReportAccessError)( doc, node, METADATA_MISSING_REDIRECT_AUTOREFRESH);
            }
            else
            {
                if ( ContainsAttr && !HasContent && !HasHttpEquiv )
                    HasMetaData = yes;                    
            }
        }

        if ( !HasMetaData && 
             nodeIsADDRESS(node) &&
             nodeIsA(node->content) )
        {
            HasMetaData = yes;
        }
            
        if ( !HasMetaData &&
             !nodeIsTITLE(node) &&
             TY_(nodeIsText)(node->content) )
        {
            ctmbstr word = textFromOneNode( doc, node->content );
            if ( !IsWhitespace(word) )
                HasMetaData = yes;
        }

        if( !HasMetaData && nodeIsLINK(node) )
        {
            AttVal* av = attrGetREL(node);
            if( !AttrContains(av, "stylesheet") )
                HasMetaData = yes;
        }
            
        /* Check for MetaData */
        for ( node = node->content; node; node = node->next )
        {
            HasMetaData = CheckMetaData( doc, node, HasMetaData );
        }
    }
    return HasMetaData;
}